

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_sse2_128_16.c
# Opt level: O3

parasail_result_t *
parasail_sw_striped_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  undefined8 uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  int iVar13;
  int iVar14;
  parasail_result_t *result;
  __m128i *b;
  __m128i *palVar15;
  __m128i *palVar16;
  __m128i *b_00;
  undefined4 in_register_0000000c;
  size_t len;
  ulong uVar17;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  ulong size;
  __m128i *ptr;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  __m128i *palVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  uint uVar29;
  uint uVar30;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  short sVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  undefined1 auVar41 [16];
  ushort uVar49;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  short sVar60;
  short sVar61;
  short sVar62;
  undefined1 auVar59 [16];
  uint uVar64;
  undefined1 auVar63 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  __m128i c;
  __m128i c_00;
  ulong local_98;
  undefined1 auVar31 [16];
  
  len = CONCAT44(in_register_0000000c,open);
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_striped_profile_sse2_128_16_cold_8();
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      parasail_sw_striped_profile_sse2_128_16_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sw_striped_profile_sse2_128_16_cold_6();
      }
      else {
        uVar19 = profile->s1Len;
        if ((int)uVar19 < 1) {
          parasail_sw_striped_profile_sse2_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_striped_profile_sse2_128_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_striped_profile_sse2_128_16_cold_3();
        }
        else if (open < 0) {
          parasail_sw_striped_profile_sse2_128_16_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_striped_profile_sse2_128_16_cold_1();
        }
        else {
          iVar14 = ppVar5->max;
          result = parasail_result_new();
          if (result != (parasail_result_t *)0x0) {
            uVar17 = (ulong)uVar19 + 7;
            size = uVar17 >> 3;
            result->flag = result->flag | 0x8200804;
            b = parasail_memalign___m128i(0x10,size);
            palVar15 = parasail_memalign___m128i(0x10,size);
            palVar16 = parasail_memalign___m128i(0x10,size);
            b_00 = parasail_memalign___m128i(0x10,size);
            auVar26._0_4_ = -(uint)((int)((ulong)b >> 0x20) == 0 && (int)b == 0);
            auVar26._4_4_ = -(uint)((int)palVar15 == 0 && (int)((ulong)palVar15 >> 0x20) == 0);
            auVar26._8_4_ = -(uint)((int)((ulong)palVar16 >> 0x20) == 0 && (int)palVar16 == 0);
            auVar26._12_4_ = -(uint)((int)b_00 == 0 && (int)((ulong)b_00 >> 0x20) == 0);
            iVar13 = movmskps((int)b_00,auVar26);
            if (iVar13 == 0) {
              local_98 = 0;
              auVar26 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
              uVar24 = auVar26._0_4_;
              auVar26 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
              uVar25 = auVar26._0_4_;
              c[1] = extraout_RDX;
              c[0] = size;
              parasail_memset___m128i(b,c,len);
              c_00[1] = extraout_RDX_00;
              c_00[0] = size;
              parasail_memset___m128i(b_00,c_00,len);
              auVar26 = _DAT_00905040;
              auVar65._4_4_ = uVar25;
              auVar65._0_4_ = uVar25;
              auVar65._8_4_ = uVar25;
              auVar65._12_4_ = uVar25;
              auVar12._4_4_ = uVar24;
              auVar12._0_4_ = uVar24;
              auVar12._8_4_ = uVar24;
              auVar12._12_4_ = uVar24;
              uVar30 = (uint)size;
              uVar22 = CONCAT62((uint6)(ushort)((uint)open >> 0x10),0x8000);
              uVar20 = 0;
              auVar39 = _DAT_00905040;
              auVar32 = _DAT_00905040;
              do {
                ptr = b;
                iVar13 = ppVar5->mapper[(byte)s2[uVar20]];
                palVar23 = palVar16;
                b = palVar15;
                if ((int)local_98 == (int)uVar20 + -2) {
                  palVar23 = palVar15;
                  b = palVar16;
                }
                uVar11 = ptr[uVar30 - 1][0];
                auVar38._0_8_ = uVar11 << 0x10;
                auVar38._8_8_ = ptr[uVar30 - 1][1] << 0x10 | uVar11 >> 0x30;
                auVar38 = auVar38 | ZEXT416(0x8000);
                lVar21 = 0;
                auVar51 = auVar39;
                auVar35 = auVar26;
                do {
                  auVar39 = paddsw(auVar38,*(undefined1 (*) [16])
                                            ((long)pvVar4 + lVar21 + (long)iVar13 * size * 0x10));
                  auVar38 = *(undefined1 (*) [16])((long)*b_00 + lVar21);
                  sVar60 = auVar35._0_2_;
                  sVar61 = auVar38._0_2_;
                  uVar49 = (ushort)(sVar61 < sVar60) * sVar60 | (ushort)(sVar61 >= sVar60) * sVar61;
                  sVar60 = auVar35._2_2_;
                  sVar61 = auVar38._2_2_;
                  uVar52 = (ushort)(sVar61 < sVar60) * sVar60 | (ushort)(sVar61 >= sVar60) * sVar61;
                  sVar60 = auVar35._4_2_;
                  sVar61 = auVar38._4_2_;
                  uVar53 = (ushort)(sVar61 < sVar60) * sVar60 | (ushort)(sVar61 >= sVar60) * sVar61;
                  sVar60 = auVar35._6_2_;
                  sVar61 = auVar38._6_2_;
                  uVar54 = (ushort)(sVar61 < sVar60) * sVar60 | (ushort)(sVar61 >= sVar60) * sVar61;
                  sVar60 = auVar35._8_2_;
                  sVar61 = auVar38._8_2_;
                  uVar55 = (ushort)(sVar61 < sVar60) * sVar60 | (ushort)(sVar61 >= sVar60) * sVar61;
                  sVar60 = auVar35._10_2_;
                  sVar61 = auVar38._10_2_;
                  uVar56 = (ushort)(sVar61 < sVar60) * sVar60 | (ushort)(sVar61 >= sVar60) * sVar61;
                  sVar60 = auVar35._12_2_;
                  sVar61 = auVar38._12_2_;
                  sVar62 = auVar38._14_2_;
                  uVar57 = (ushort)(sVar61 < sVar60) * sVar60 | (ushort)(sVar61 >= sVar60) * sVar61;
                  sVar60 = auVar35._14_2_;
                  uVar58 = (ushort)(sVar62 < sVar60) * sVar60 | (ushort)(sVar62 >= sVar60) * sVar62;
                  sVar60 = auVar39._0_2_;
                  auVar50._0_2_ =
                       (ushort)((short)uVar49 < sVar60) * sVar60 |
                       ((short)uVar49 >= sVar60) * uVar49;
                  sVar60 = auVar39._2_2_;
                  auVar50._2_2_ =
                       (ushort)((short)uVar52 < sVar60) * sVar60 |
                       ((short)uVar52 >= sVar60) * uVar52;
                  sVar60 = auVar39._4_2_;
                  auVar50._4_2_ =
                       (ushort)((short)uVar53 < sVar60) * sVar60 |
                       ((short)uVar53 >= sVar60) * uVar53;
                  sVar60 = auVar39._6_2_;
                  auVar50._6_2_ =
                       (ushort)((short)uVar54 < sVar60) * sVar60 |
                       ((short)uVar54 >= sVar60) * uVar54;
                  sVar60 = auVar39._8_2_;
                  auVar50._8_2_ =
                       (ushort)((short)uVar55 < sVar60) * sVar60 |
                       ((short)uVar55 >= sVar60) * uVar55;
                  sVar60 = auVar39._10_2_;
                  auVar50._10_2_ =
                       (ushort)((short)uVar56 < sVar60) * sVar60 |
                       ((short)uVar56 >= sVar60) * uVar56;
                  sVar60 = auVar39._12_2_;
                  auVar50._12_2_ =
                       (ushort)((short)uVar57 < sVar60) * sVar60 |
                       ((short)uVar57 >= sVar60) * uVar57;
                  sVar60 = auVar39._14_2_;
                  auVar50._14_2_ =
                       (ushort)((short)uVar58 < sVar60) * sVar60 |
                       ((short)uVar58 >= sVar60) * uVar58;
                  *(undefined1 (*) [16])((long)*b + lVar21) = auVar50;
                  sVar60 = auVar51._0_2_;
                  auVar39._0_2_ =
                       (sVar60 < (short)auVar50._0_2_) * auVar50._0_2_ |
                       (ushort)(sVar60 >= (short)auVar50._0_2_) * sVar60;
                  sVar60 = auVar51._2_2_;
                  auVar39._2_2_ =
                       (sVar60 < (short)auVar50._2_2_) * auVar50._2_2_ |
                       (ushort)(sVar60 >= (short)auVar50._2_2_) * sVar60;
                  sVar60 = auVar51._4_2_;
                  auVar39._4_2_ =
                       (sVar60 < (short)auVar50._4_2_) * auVar50._4_2_ |
                       (ushort)(sVar60 >= (short)auVar50._4_2_) * sVar60;
                  sVar60 = auVar51._6_2_;
                  auVar39._6_2_ =
                       (sVar60 < (short)auVar50._6_2_) * auVar50._6_2_ |
                       (ushort)(sVar60 >= (short)auVar50._6_2_) * sVar60;
                  sVar60 = auVar51._8_2_;
                  auVar39._8_2_ =
                       (sVar60 < (short)auVar50._8_2_) * auVar50._8_2_ |
                       (ushort)(sVar60 >= (short)auVar50._8_2_) * sVar60;
                  sVar60 = auVar51._10_2_;
                  auVar39._10_2_ =
                       (sVar60 < (short)auVar50._10_2_) * auVar50._10_2_ |
                       (ushort)(sVar60 >= (short)auVar50._10_2_) * sVar60;
                  sVar60 = auVar51._12_2_;
                  sVar61 = auVar51._14_2_;
                  auVar39._12_2_ =
                       (sVar60 < (short)auVar50._12_2_) * auVar50._12_2_ |
                       (ushort)(sVar60 >= (short)auVar50._12_2_) * sVar60;
                  auVar39._14_2_ =
                       (sVar61 < (short)auVar50._14_2_) * auVar50._14_2_ |
                       (ushort)(sVar61 >= (short)auVar50._14_2_) * sVar61;
                  auVar51 = psubsw(auVar50,auVar12);
                  auVar38 = psubsw(auVar38,auVar65);
                  sVar60 = auVar51._0_2_;
                  sVar34 = auVar38._0_2_;
                  sVar61 = auVar51._2_2_;
                  sVar42 = auVar38._2_2_;
                  sVar62 = auVar51._4_2_;
                  sVar43 = auVar38._4_2_;
                  sVar6 = auVar51._6_2_;
                  sVar44 = auVar38._6_2_;
                  sVar7 = auVar51._8_2_;
                  sVar45 = auVar38._8_2_;
                  sVar8 = auVar51._10_2_;
                  sVar46 = auVar38._10_2_;
                  sVar9 = auVar51._12_2_;
                  sVar47 = auVar38._12_2_;
                  sVar48 = auVar38._14_2_;
                  sVar10 = auVar51._14_2_;
                  puVar1 = (ushort *)((long)*b_00 + lVar21);
                  *puVar1 = (ushort)(sVar34 < sVar60) * sVar60 | (ushort)(sVar34 >= sVar60) * sVar34
                  ;
                  puVar1[1] = (ushort)(sVar42 < sVar61) * sVar61 |
                              (ushort)(sVar42 >= sVar61) * sVar42;
                  puVar1[2] = (ushort)(sVar43 < sVar62) * sVar62 |
                              (ushort)(sVar43 >= sVar62) * sVar43;
                  puVar1[3] = (ushort)(sVar44 < sVar6) * sVar6 | (ushort)(sVar44 >= sVar6) * sVar44;
                  puVar1[4] = (ushort)(sVar45 < sVar7) * sVar7 | (ushort)(sVar45 >= sVar7) * sVar45;
                  puVar1[5] = (ushort)(sVar46 < sVar8) * sVar8 | (ushort)(sVar46 >= sVar8) * sVar46;
                  puVar1[6] = (ushort)(sVar47 < sVar9) * sVar9 | (ushort)(sVar47 >= sVar9) * sVar47;
                  puVar1[7] = (ushort)(sVar48 < sVar10) * sVar10 |
                              (ushort)(sVar48 >= sVar10) * sVar48;
                  auVar38 = psubsw(auVar35,auVar65);
                  sVar34 = auVar38._0_2_;
                  auVar35._0_2_ =
                       (ushort)(sVar34 < sVar60) * sVar60 | (ushort)(sVar34 >= sVar60) * sVar34;
                  sVar60 = auVar38._2_2_;
                  auVar35._2_2_ =
                       (ushort)(sVar60 < sVar61) * sVar61 | (ushort)(sVar60 >= sVar61) * sVar60;
                  sVar60 = auVar38._4_2_;
                  auVar35._4_2_ =
                       (ushort)(sVar60 < sVar62) * sVar62 | (ushort)(sVar60 >= sVar62) * sVar60;
                  sVar60 = auVar38._6_2_;
                  auVar35._6_2_ =
                       (ushort)(sVar60 < sVar6) * sVar6 | (ushort)(sVar60 >= sVar6) * sVar60;
                  sVar60 = auVar38._8_2_;
                  auVar35._8_2_ =
                       (ushort)(sVar60 < sVar7) * sVar7 | (ushort)(sVar60 >= sVar7) * sVar60;
                  sVar60 = auVar38._10_2_;
                  auVar35._10_2_ =
                       (ushort)(sVar60 < sVar8) * sVar8 | (ushort)(sVar60 >= sVar8) * sVar60;
                  sVar60 = auVar38._12_2_;
                  sVar61 = auVar38._14_2_;
                  auVar35._12_2_ =
                       (ushort)(sVar60 < sVar9) * sVar9 | (ushort)(sVar60 >= sVar9) * sVar60;
                  auVar35._14_2_ =
                       (ushort)(sVar61 < sVar10) * sVar10 | (ushort)(sVar61 >= sVar10) * sVar61;
                  auVar38 = *(undefined1 (*) [16])((long)*ptr + lVar21);
                  lVar21 = lVar21 + 0x10;
                  auVar51 = auVar39;
                } while (size << 4 != lVar21);
                iVar13 = 0;
                do {
                  auVar51._0_8_ = auVar35._0_8_ << 0x10;
                  auVar51._8_8_ = auVar35._8_8_ << 0x10 | auVar35._0_8_ >> 0x30;
                  auVar35 = auVar51 | ZEXT416(0x8000);
                  lVar21 = 0;
                  auVar38 = auVar39;
                  do {
                    psVar2 = (short *)((long)*b + lVar21);
                    sVar61 = *psVar2;
                    sVar62 = psVar2[1];
                    sVar6 = psVar2[2];
                    sVar7 = psVar2[3];
                    sVar8 = psVar2[4];
                    sVar9 = psVar2[5];
                    sVar10 = psVar2[6];
                    sVar34 = psVar2[7];
                    sVar60 = auVar35._0_2_;
                    auVar40._0_2_ =
                         (ushort)(sVar61 < sVar60) * sVar60 | (ushort)(sVar61 >= sVar60) * sVar61;
                    sVar60 = auVar35._2_2_;
                    auVar40._2_2_ =
                         (ushort)(sVar62 < sVar60) * sVar60 | (ushort)(sVar62 >= sVar60) * sVar62;
                    sVar60 = auVar35._4_2_;
                    auVar40._4_2_ =
                         (ushort)(sVar6 < sVar60) * sVar60 | (ushort)(sVar6 >= sVar60) * sVar6;
                    sVar60 = auVar35._6_2_;
                    auVar40._6_2_ =
                         (ushort)(sVar7 < sVar60) * sVar60 | (ushort)(sVar7 >= sVar60) * sVar7;
                    sVar60 = auVar35._8_2_;
                    auVar40._8_2_ =
                         (ushort)(sVar8 < sVar60) * sVar60 | (ushort)(sVar8 >= sVar60) * sVar8;
                    sVar60 = auVar35._10_2_;
                    auVar40._10_2_ =
                         (ushort)(sVar9 < sVar60) * sVar60 | (ushort)(sVar9 >= sVar60) * sVar9;
                    sVar60 = auVar35._12_2_;
                    auVar40._12_2_ =
                         (ushort)(sVar10 < sVar60) * sVar60 | (ushort)(sVar10 >= sVar60) * sVar10;
                    sVar60 = auVar35._14_2_;
                    auVar40._14_2_ =
                         (ushort)(sVar34 < sVar60) * sVar60 | (ushort)(sVar34 >= sVar60) * sVar34;
                    *(undefined1 (*) [16])((long)*b + lVar21) = auVar40;
                    sVar60 = auVar38._0_2_;
                    auVar39._0_2_ =
                         (sVar60 < (short)auVar40._0_2_) * auVar40._0_2_ |
                         (ushort)(sVar60 >= (short)auVar40._0_2_) * sVar60;
                    sVar60 = auVar38._2_2_;
                    auVar39._2_2_ =
                         (sVar60 < (short)auVar40._2_2_) * auVar40._2_2_ |
                         (ushort)(sVar60 >= (short)auVar40._2_2_) * sVar60;
                    sVar60 = auVar38._4_2_;
                    auVar39._4_2_ =
                         (sVar60 < (short)auVar40._4_2_) * auVar40._4_2_ |
                         (ushort)(sVar60 >= (short)auVar40._4_2_) * sVar60;
                    sVar60 = auVar38._6_2_;
                    auVar39._6_2_ =
                         (sVar60 < (short)auVar40._6_2_) * auVar40._6_2_ |
                         (ushort)(sVar60 >= (short)auVar40._6_2_) * sVar60;
                    sVar60 = auVar38._8_2_;
                    auVar39._8_2_ =
                         (sVar60 < (short)auVar40._8_2_) * auVar40._8_2_ |
                         (ushort)(sVar60 >= (short)auVar40._8_2_) * sVar60;
                    sVar60 = auVar38._10_2_;
                    auVar39._10_2_ =
                         (sVar60 < (short)auVar40._10_2_) * auVar40._10_2_ |
                         (ushort)(sVar60 >= (short)auVar40._10_2_) * sVar60;
                    sVar60 = auVar38._12_2_;
                    sVar61 = auVar38._14_2_;
                    auVar39._12_2_ =
                         (sVar60 < (short)auVar40._12_2_) * auVar40._12_2_ |
                         (ushort)(sVar60 >= (short)auVar40._12_2_) * sVar60;
                    auVar39._14_2_ =
                         (sVar61 < (short)auVar40._14_2_) * auVar40._14_2_ |
                         (ushort)(sVar61 >= (short)auVar40._14_2_) * sVar61;
                    auVar38 = psubsw(auVar40,auVar12);
                    auVar35 = psubsw(auVar35,auVar65);
                    auVar41._0_2_ = -(ushort)(auVar38._0_2_ < auVar35._0_2_);
                    auVar41._2_2_ = -(ushort)(auVar38._2_2_ < auVar35._2_2_);
                    auVar41._4_2_ = -(ushort)(auVar38._4_2_ < auVar35._4_2_);
                    auVar41._6_2_ = -(ushort)(auVar38._6_2_ < auVar35._6_2_);
                    auVar41._8_2_ = -(ushort)(auVar38._8_2_ < auVar35._8_2_);
                    auVar41._10_2_ = -(ushort)(auVar38._10_2_ < auVar35._10_2_);
                    auVar41._12_2_ = -(ushort)(auVar38._12_2_ < auVar35._12_2_);
                    auVar41._14_2_ = -(ushort)(auVar38._14_2_ < auVar35._14_2_);
                    if ((((((((((((((((auVar41 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar41 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar41 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar41 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar41 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar41 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar41 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar41 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar41 >> 0x47 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar41 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar41 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar41 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar41 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar41 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar41._14_2_ >> 7 & 1) == 0) && (auVar41._14_2_ & 0x8000) == 0)
                    goto LAB_0057895b;
                    lVar21 = lVar21 + 0x10;
                    auVar38 = auVar39;
                  } while (size << 4 != lVar21);
                  iVar13 = iVar13 + 1;
                } while (iVar13 != 8);
LAB_0057895b:
                auVar36._0_2_ = -(ushort)(auVar32._0_2_ < (short)auVar39._0_2_);
                auVar36._2_2_ = -(ushort)(auVar32._2_2_ < (short)auVar39._2_2_);
                auVar36._4_2_ = -(ushort)(auVar32._4_2_ < (short)auVar39._4_2_);
                auVar36._6_2_ = -(ushort)(auVar32._6_2_ < (short)auVar39._6_2_);
                auVar36._8_2_ = -(ushort)(auVar32._8_2_ < (short)auVar39._8_2_);
                auVar36._10_2_ = -(ushort)(auVar32._10_2_ < (short)auVar39._10_2_);
                auVar36._12_2_ = -(ushort)(auVar32._12_2_ < (short)auVar39._12_2_);
                auVar36._14_2_ = -(ushort)(auVar32._14_2_ < (short)auVar39._14_2_);
                if ((((((((((((((((auVar36 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar36 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar36 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar36 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar36 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar36 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar36 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar36 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar36 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar36 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar36 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar36 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar36 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar36 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar36._14_2_ >> 7 & 1) != 0) || (auVar36._14_2_ & 0x8000) != 0) {
                  uVar49 = ((short)auVar39._8_2_ < (short)auVar39._0_2_) * auVar39._0_2_ |
                           ((short)auVar39._8_2_ >= (short)auVar39._0_2_) * auVar39._8_2_;
                  uVar52 = ((short)auVar39._10_2_ < (short)auVar39._2_2_) * auVar39._2_2_ |
                           ((short)auVar39._10_2_ >= (short)auVar39._2_2_) * auVar39._10_2_;
                  uVar53 = ((short)auVar39._12_2_ < (short)auVar39._4_2_) * auVar39._4_2_ |
                           ((short)auVar39._12_2_ >= (short)auVar39._4_2_) * auVar39._12_2_;
                  uVar54 = ((short)auVar39._14_2_ < (short)auVar39._6_2_) * auVar39._6_2_ |
                           ((short)auVar39._14_2_ >= (short)auVar39._6_2_) * auVar39._14_2_;
                  sVar61 = (0 < (short)auVar39._8_2_) * auVar39._8_2_;
                  sVar60 = (0 < (short)auVar39._10_2_) * auVar39._10_2_;
                  sVar6 = (0 < (short)auVar39._12_2_) * auVar39._12_2_;
                  sVar62 = (0 < (short)auVar39._14_2_) * auVar39._14_2_;
                  uVar49 = ((short)uVar53 < (short)uVar49) * uVar49 |
                           ((short)uVar53 >= (short)uVar49) * uVar53;
                  uVar52 = ((short)uVar54 < (short)uVar52) * uVar52 |
                           ((short)uVar54 >= (short)uVar52) * uVar54;
                  uVar53 = (sVar61 < (short)uVar53) * uVar53 |
                           (ushort)(sVar61 >= (short)uVar53) * sVar61;
                  uVar54 = (sVar60 < (short)uVar54) * uVar54 |
                           (ushort)(sVar60 >= (short)uVar54) * sVar60;
                  uVar55 = (ushort)(sVar6 < sVar61) * sVar61 | (ushort)(sVar6 >= sVar61) * sVar6;
                  uVar56 = (ushort)(sVar62 < sVar60) * sVar60 | (ushort)(sVar62 >= sVar60) * sVar62;
                  sVar6 = (ushort)(0 < sVar6) * sVar6;
                  sVar62 = (ushort)(0 < sVar62) * sVar62;
                  uVar49 = ((short)uVar52 < (short)uVar49) * uVar49 |
                           ((short)uVar52 >= (short)uVar49) * uVar52;
                  uVar29 = CONCAT22(((short)uVar53 < (short)uVar52) * uVar52 |
                                    ((short)uVar53 >= (short)uVar52) * uVar53,uVar49);
                  auVar31._0_6_ =
                       CONCAT24(((short)uVar54 < (short)uVar53) * uVar53 |
                                ((short)uVar54 >= (short)uVar53) * uVar54,uVar29);
                  auVar31._6_2_ =
                       ((short)uVar55 < (short)uVar54) * uVar54 |
                       ((short)uVar55 >= (short)uVar54) * uVar55;
                  auVar31._8_2_ =
                       ((short)uVar56 < (short)uVar55) * uVar55 |
                       ((short)uVar56 >= (short)uVar55) * uVar56;
                  auVar31._10_2_ =
                       (sVar6 < (short)uVar56) * uVar56 | (ushort)(sVar6 >= (short)uVar56) * sVar6;
                  auVar31._12_2_ =
                       (ushort)(sVar62 < sVar6) * sVar6 | (ushort)(sVar62 >= sVar6) * sVar62;
                  auVar31._14_2_ = (ushort)(0 < sVar62) * sVar62;
                  uVar22 = (ulong)auVar31._0_6_ & 0xffffffff;
                  if ((short)(0x7ffe - (short)iVar14) < (short)uVar49) {
                    *(byte *)&result->flag = (byte)result->flag | 0x40;
                    s2Len = (int)uVar20;
                    break;
                  }
                  auVar32 = pshuflw(auVar31,auVar31,0);
                  auVar32._4_4_ = auVar32._0_4_;
                  auVar32._8_4_ = auVar32._0_4_;
                  auVar32._12_4_ = auVar32._0_4_;
                  local_98 = uVar20 & 0xffffffff;
                }
                uVar29 = (uint)uVar22;
                uVar20 = uVar20 + 1;
                palVar15 = ptr;
                palVar16 = palVar23;
              } while (uVar20 != (uint)s2Len);
              if ((uVar29 & 0xffff) == 0x7fff) {
                *(byte *)&result->flag = (byte)result->flag | 0x40;
              }
              iVar14 = parasail_result_is_saturated(result);
              palVar15 = palVar23;
              if (iVar14 == 0) {
                palVar16 = ptr;
                if ((int)local_98 == s2Len + -2) {
                  palVar15 = ptr;
                  palVar16 = palVar23;
                }
                if ((int)local_98 == s2Len + -1) {
                  palVar15 = b;
                  b = palVar23;
                  palVar16 = ptr;
                }
                ptr = palVar16;
                uVar19 = uVar19 - 1;
                if ((uVar17 & 0x7ffffff8) != 0) {
                  if ((uVar17 & 0x7ffffff8) == 0) {
                    uVar17 = 0;
                    do {
                      if ((*(short *)((long)*palVar15 + uVar17 * 2) == (short)uVar29) &&
                         (uVar18 = ((uint)uVar17 & 7) * uVar30 | (uint)(uVar17 >> 3) & 0x1fffffff,
                         (int)uVar18 < (int)uVar19)) {
                        uVar19 = uVar18;
                      }
                      uVar17 = uVar17 + 1;
                    } while ((uVar30 & 0xfffffff) << 3 != (int)uVar17);
                  }
                  else {
                    auVar27._4_4_ = uVar19;
                    auVar27._0_4_ = uVar19;
                    auVar27._8_4_ = uVar19;
                    auVar27._12_4_ = uVar19;
                    auVar26 = pshuflw(ZEXT416(uVar29),ZEXT416(uVar29),0);
                    uVar20 = 0;
                    auVar37 = _DAT_00904a60;
                    do {
                      uVar3 = *(undefined8 *)((long)*palVar15 + uVar20 * 2);
                      auVar59._0_2_ = -(ushort)((short)uVar3 == auVar26._0_2_);
                      sVar60 = -(ushort)((short)((ulong)uVar3 >> 0x10) == auVar26._2_2_);
                      sVar61 = -(ushort)((short)((ulong)uVar3 >> 0x20) == auVar26._4_2_);
                      sVar62 = -(ushort)((short)((ulong)uVar3 >> 0x30) == auVar26._6_2_);
                      auVar59._8_8_ =
                           (undefined8)
                           (CONCAT64(CONCAT42(CONCAT22(sVar62,sVar62),sVar61),
                                     CONCAT22(sVar61,sVar62)) >> 0x10);
                      auVar59._6_2_ = sVar60;
                      auVar59._4_2_ = sVar60;
                      auVar59._2_2_ = auVar59._0_2_;
                      uVar19 = auVar37._4_4_;
                      uVar18 = auVar37._8_4_;
                      uVar64 = auVar37._12_4_;
                      auVar65 = auVar37 & _DAT_00904b30;
                      auVar66._0_4_ = auVar65._0_4_ * uVar30 + (auVar37._0_4_ >> 3);
                      auVar66._4_4_ = auVar65._4_4_ * uVar30 + (uVar19 >> 3);
                      auVar66._8_4_ = (int)((auVar65._8_8_ & 0xffffffff) * size) + (uVar18 >> 3);
                      auVar66._12_4_ = auVar65._12_4_ * uVar30 + (uVar64 >> 3);
                      auVar63._0_4_ = -(uint)(auVar66._0_4_ < auVar27._0_4_);
                      auVar63._4_4_ = -(uint)(auVar66._4_4_ < auVar27._4_4_);
                      auVar63._8_4_ = -(uint)(auVar66._8_4_ < auVar27._8_4_);
                      auVar63._12_4_ = -(uint)(auVar66._12_4_ < auVar27._12_4_);
                      auVar27 = ~auVar59 & auVar27 |
                                (~auVar63 & auVar27 | auVar66 & auVar63) & auVar59;
                      uVar20 = uVar20 + 4;
                      auVar37._0_4_ = auVar37._0_4_ + 4;
                      auVar37._4_4_ = uVar19 + 4;
                      auVar37._8_4_ = uVar18 + 4;
                      auVar37._12_4_ = uVar64 + 4;
                    } while (((uint)uVar17 & 0x7ffffff8) != uVar20);
                    auVar28._0_8_ = auVar27._8_8_;
                    auVar28._8_4_ = auVar27._8_4_;
                    auVar28._12_4_ = auVar27._12_4_;
                    auVar33._0_4_ = -(uint)(auVar27._0_4_ < auVar27._8_4_);
                    auVar33._4_4_ = -(uint)(auVar27._4_4_ < auVar27._12_4_);
                    auVar33._8_8_ = 0;
                    auVar26 = ~auVar33 & auVar28 | auVar27 & auVar33;
                    uVar30 = auVar26._0_4_;
                    uVar18 = auVar26._4_4_;
                    uVar19 = -(uint)((int)uVar30 < (int)uVar18);
                    uVar19 = ~uVar19 & uVar18 | uVar30 & uVar19;
                  }
                }
                iVar14 = (short)uVar29 + 0x8000;
              }
              else {
                local_98._0_4_ = 0;
                iVar14 = 0xffff;
                uVar19 = 0;
              }
              result->score = iVar14;
              result->end_query = uVar19;
              result->end_ref = (int)local_98;
              parasail_free(b_00);
              parasail_free(palVar15);
              parasail_free(ptr);
              parasail_free(b);
              return result;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvE = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    int16_t bias = 0;
    int16_t score = 0;
    __m128i vBias;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int16_t maxp = 0;
    __m128i insert_mask;
    /*int16_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    vZero = _mm_set1_epi16(0);
    bias = INT16_MIN;
    score = bias;
    vBias = _mm_set1_epi16(bias);
    vMaxH = vBias;
    vMaxHUnit = vBias;
    maxp = INT16_MAX - (int16_t)(matrix->max+1);
    insert_mask = _mm_cmpgt_epi16(
            _mm_set_epi16(0,0,0,0,0,0,0,1),
            vZero);
    /*stop = profile->stop == INT32_MAX ?  INT16_MAX : (int16_t)profile->stop-bias;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vBias, segLen);
    parasail_memset___m128i(pvE, vBias, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vF;
        __m128i vH;
        const __m128i* vP = NULL;
        __m128i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vBias;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm_slli_si128(pvHStore[segLen - 1], 2);
        vH = _mm_blendv_epi8_rpl(vH, vBias, insert_mask);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi16(vH, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
            vMaxH = _mm_max_epi16(vH, vMaxH);

            /* Update vE value. */
            vH = _mm_subs_epi16(vH, vGapO);
            vE = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_blendv_epi8_rpl(vF, vBias, insert_mask);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
                vMaxH = _mm_max_epi16(vH, vMaxH);
                vH = _mm_subs_epi16(vH, vGapO);
                vF = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm_max_epi16(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7) - bias;
        }
#endif

        {
            __m128i vCompare = _mm_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi16_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi16(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen, bias);
    }
#endif

    if (score == INT16_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT16_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m128i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m128i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int16_t *t = (int16_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score - bias;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}